

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-test.cc
# Opt level: O2

void __thiscall
ProblemTest_IncompleteNonlinearCon_Test::TestBody(ProblemTest_IncompleteNonlinearCon_Test *this)

{
  pointer pBVar1;
  NumericConstant expr;
  char *message;
  MutAlgebraicCon MVar2;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_380;
  AssertHelper local_378;
  AssertionResult gtest_ar;
  Problem p;
  
  mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblem(&p);
  MVar2 = mp::BasicProblem<mp::BasicProblemParams<int>_>::AddCon(&p,0.0,1.0);
  gtest_ar._0_8_ =
       MVar2.
       super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  gtest_ar.message_.ptr_._0_4_ =
       MVar2.
       super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  expr = mp::BasicExprFactory<std::allocator<char>_>::MakeNumericConstant(&p.super_ExprFactory,42.0)
  ;
  mp::BasicProblem<mp::BasicProblemParams<int>_>::MutAlgebraicCon::set_nonlinear_expr
            ((MutAlgebraicCon *)&gtest_ar,
             (NumericExpr)
             expr.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::AddCon(&p,0.0,1.0);
  local_380.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  MVar2 = mp::BasicProblem<mp::BasicProblemParams<int>_>::algebraic_con(&p,1);
  pBVar1 = ((MVar2.
             super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
             .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_)->
           nonlinear_cons_).
           super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)(long)MVar2.
                   super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                   .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_ <
      (ulong)((long)((MVar2.
                      super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                      .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
                     problem_)->nonlinear_cons_).
                    super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1 >> 3)) {
    local_378.data_ =
         (AssertHelperData *)
         pBVar1[MVar2.
                super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_].
         super_ExprBase.impl_;
  }
  else {
    local_378.data_ = (AssertHelperData *)0x0;
  }
  testing::internal::
  CmpHelperEQ<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            ((internal *)&gtest_ar,"mp::NumericExpr()","p.algebraic_con(1).nonlinear_expr()",
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)&local_380,
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)&local_378);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_380);
    if ((undefined8 *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(int)gtest_ar.message_.ptr_) ==
        (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = *(char **)CONCAT44(gtest_ar.message_.ptr_._4_4_,(int)gtest_ar.message_.ptr_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_378,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x154,message);
    testing::internal::AssertHelper::operator=(&local_378,(Message *)&local_380);
    testing::internal::AssertHelper::~AssertHelper(&local_378);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_380);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::~BasicProblem(&p);
  return;
}

Assistant:

TEST(ProblemTest, IncompleteNonlinearCon) {
  Problem p;
  p.AddCon(0, 1).set_nonlinear_expr(p.MakeNumericConstant(42));
  p.AddCon(0, 1);
  EXPECT_EQ(mp::NumericExpr(), p.algebraic_con(1).nonlinear_expr());
}